

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O2

bool __thiscall hwtest::pgraph::MthdEmuD3D56TlvZ::is_valid_val(MthdEmuD3D56TlvZ *this)

{
  return (this->super_SingleMthdTest).super_MthdTest.val < 0x3f800000 ||
         (this->super_SingleMthdTest).super_MthdTest.cls != 0x48;
}

Assistant:

bool is_valid_val() override {
		if (cls == 0x48) {
			if (extr(val, 31, 1))
				return false;
			int e = extr(val, 23, 8);
			if (e >= 0x7f)
				return false;
		}
		return true;
	}